

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O0

int64_t cornelich::get_epoch_seconds(time_point *ts)

{
  type_conflict1 tVar1;
  int local_4c;
  duration<long,_std::ratio<1L,_1L>_> local_48;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40 [2];
  int64_t unix_timestamp;
  type s;
  days days_since_epoch;
  time_point this_morning;
  day_point today;
  time_point *ts_local;
  
  this_morning.__d.__r._4_4_ =
       std::chrono::
       time_point_cast<std::chrono::duration<int,std::ratio<86400l,1l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                 (ts);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
  ::time_point<std::chrono::duration<int,std::ratio<86400l,1l>>,void>
            ((time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              *)&stack0xffffffffffffffe0,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>
              *)((long)&this_morning.__d.__r + 4));
  s.__r._4_4_ = std::chrono::operator-
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>
                            *)((long)&this_morning.__d.__r + 4),
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>
                            *)&unix_epoch);
  unix_timestamp =
       (int64_t)std::chrono::operator-
                          (ts,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)&stack0xffffffffffffffe0);
  local_40[0].__r =
       (rep_conflict)
       std::chrono::operator+
                 ((duration<int,_std::ratio<86400L,_1L>_> *)((long)&s.__r + 4),
                  (duration<long,_std::ratio<1L,_1000000000L>_> *)&unix_timestamp);
  local_4c = 1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_48,&local_4c);
  tVar1 = std::chrono::operator/(local_40,&local_48);
  return tVar1;
}

Assistant:

std::int64_t get_epoch_seconds(const system_clock::time_point & ts)
{
    day_point today = time_point_cast<days>(ts);
    system_clock::time_point this_morning = today;
    days days_since_epoch = today - unix_epoch;
    auto s = ts - this_morning;
    std::int64_t unix_timestamp = (days_since_epoch + s) / seconds(1);
    return unix_timestamp;
}